

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::FieldDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar4;
  int line;
  Arena *pAVar5;
  Arena *arena;
  FieldDescriptorProto *_this;
  FieldDescriptorProto *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (FieldDescriptorProto *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::FieldDescriptorProto_const*,google::protobuf::FieldDescriptorProto*>
                          ((FieldDescriptorProto **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x1677;
LAB_0020c52b:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      uVar2 = from_msg[1]._internal_metadata_.ptr_;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.name_,(string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
    }
    if ((uVar1 & 2) != 0) {
      pp_Var3 = from_msg[2]._vptr_MessageLite;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 2;
      pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.extendee_,
                 (string *)((ulong)pp_Var3 & 0xfffffffffffffffc),pAVar5);
    }
    if ((uVar1 & 4) != 0) {
      uVar2 = from_msg[2]._internal_metadata_.ptr_;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 4;
      pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.type_name_,(string *)(uVar2 & 0xfffffffffffffffc),
                 pAVar5);
    }
    if ((uVar1 & 8) != 0) {
      pp_Var3 = from_msg[3]._vptr_MessageLite;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 8;
      pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.default_value_,
                 (string *)((ulong)pp_Var3 & 0xfffffffffffffffc),pAVar5);
    }
    if ((uVar1 & 0x10) != 0) {
      uVar2 = from_msg[3]._internal_metadata_.ptr_;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 0x10;
      pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.json_name_,(string *)(uVar2 & 0xfffffffffffffffc),
                 pAVar5);
    }
    if ((uVar1 & 0x20) != 0) {
      from_msg_00 = (MessageLite *)from_msg[4]._vptr_MessageLite;
      if (from_msg_00 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.options_ != nullptr";
        line = 0x168d;
        goto LAB_0020c52b;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x30);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar4 = Arena::CopyConstruct<google::protobuf::FieldOptions>(arena,from_msg_00);
        *(void **)((long)&local_30->field_0 + 0x30) = pvVar4;
      }
      else {
        FieldOptions::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar1 & 0x40) != 0) {
      *(int *)((long)&local_30->field_0 + 0x38) = (int)from_msg[4]._internal_metadata_.ptr_;
    }
    if ((char)uVar1 < '\0') {
      (local_30->field_0)._impl_.oneof_index_ =
           *(int32_t *)((long)&from_msg[4]._internal_metadata_.ptr_ + 4);
    }
  }
  if ((uVar1 & 0x700) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      *(undefined1 *)((long)&local_30->field_0 + 0x40) =
           *(undefined1 *)&from_msg[5]._vptr_MessageLite;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      (local_30->field_0)._impl_.label_ = *(int *)((long)&from_msg[5]._vptr_MessageLite + 4);
    }
    if ((uVar1 >> 10 & 1) != 0) {
      *(int *)((long)&local_30->field_0 + 0x48) = (int)from_msg[5]._internal_metadata_.ptr_;
    }
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void FieldDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FieldDescriptorProto*>(&to_msg);
  auto& from = static_cast<const FieldDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_extendee(from._internal_extendee());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_type_name(from._internal_type_name());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_default_value(from._internal_default_value());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_internal_set_json_name(from._internal_json_name());
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.number_ = from._impl_.number_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.oneof_index_ = from._impl_.oneof_index_;
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.proto3_optional_ = from._impl_.proto3_optional_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.label_ = from._impl_.label_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.type_ = from._impl_.type_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}